

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

void __thiscall
QHashPrivate::Node<QString,_QMimeTypeXMLData>::emplaceValue<QMimeTypeXMLData>
          (Node<QString,_QMimeTypeXMLData> *this,QMimeTypeXMLData *args)

{
  QMimeTypeXMLData *in_RDI;
  long in_FS_OFFSET;
  QMimeTypeXMLData *this_00;
  QMimeTypeXMLData local_78;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &local_78;
  QMimeTypeXMLData::QMimeTypeXMLData(this_00,in_RDI);
  QMimeTypeXMLData::operator=(this_00,in_RDI);
  QMimeTypeXMLData::~QMimeTypeXMLData(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplaceValue(Args &&... args)
    {
        value = T(std::forward<Args>(args)...);
    }